

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlRegFreeExecCtxt(xmlRegExecCtxtPtr exec)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  if (exec != (xmlRegExecCtxtPtr)0x0) {
    if (exec->rollbacks != (xmlRegExecRollback *)0x0) {
      if ((exec->counts != (int *)0x0) && (0 < exec->maxRollbacks)) {
        lVar2 = 0x10;
        lVar3 = 0;
        do {
          pvVar1 = *(void **)((long)&exec->rollbacks->state + lVar2);
          if (pvVar1 != (void *)0x0) {
            (*xmlFree)(pvVar1);
          }
          lVar3 = lVar3 + 1;
          lVar2 = lVar2 + 0x18;
        } while (lVar3 < exec->maxRollbacks);
      }
      (*xmlFree)(exec->rollbacks);
    }
    if (exec->counts != (int *)0x0) {
      (*xmlFree)(exec->counts);
    }
    if (exec->inputStack != (xmlRegInputTokenPtr)0x0) {
      if (0 < exec->inputStackNr) {
        lVar3 = 0;
        lVar2 = 0;
        do {
          pvVar1 = *(void **)((long)&exec->inputStack->value + lVar3);
          if (pvVar1 != (void *)0x0) {
            (*xmlFree)(pvVar1);
          }
          lVar2 = lVar2 + 1;
          lVar3 = lVar3 + 0x10;
        } while (lVar2 < exec->inputStackNr);
      }
      (*xmlFree)(exec->inputStack);
    }
    if (exec->errString != (xmlChar *)0x0) {
      (*xmlFree)(exec->errString);
    }
    (*xmlFree)(exec);
    return;
  }
  return;
}

Assistant:

void
xmlRegFreeExecCtxt(xmlRegExecCtxtPtr exec) {
    if (exec == NULL)
	return;

    if (exec->rollbacks != NULL) {
	if (exec->counts != NULL) {
	    int i;

	    for (i = 0;i < exec->maxRollbacks;i++)
		if (exec->rollbacks[i].counts != NULL)
		    xmlFree(exec->rollbacks[i].counts);
	}
	xmlFree(exec->rollbacks);
    }
    if (exec->counts != NULL)
	xmlFree(exec->counts);
    if (exec->inputStack != NULL) {
	int i;

	for (i = 0;i < exec->inputStackNr;i++) {
	    if (exec->inputStack[i].value != NULL)
		xmlFree(exec->inputStack[i].value);
	}
	xmlFree(exec->inputStack);
    }
    if (exec->errString != NULL)
        xmlFree(exec->errString);
    xmlFree(exec);
}